

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise3d.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise3D::forward
          (ConvolutionDepthWise3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  float fVar3;
  float fVar4;
  float wt;
  float val_1;
  int l;
  float *sptr_1;
  Mat m_4;
  int q;
  float *kptr_1;
  float sum_1;
  int j_2;
  int i_2;
  int z_2;
  int outd_1;
  int outh_1;
  int outw_1;
  float *weight_data_ptr;
  float *outptr_1;
  int p;
  int g_1;
  int num_output_g;
  int channels_g;
  float w_1;
  float val;
  int k;
  float *sptr;
  float sum;
  int j_1;
  int i_1;
  int z_1;
  Mat m;
  float *kptr;
  float *outptr;
  int g;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int kernel_extend_d;
  int kernel_extend_h;
  int kernel_extend_w;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_5;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  size_t in_stack_fffffffffffff4f8;
  void **ppvVar5;
  int in_stack_fffffffffffff500;
  float in_stack_fffffffffffff504;
  int in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  Mat *in_stack_fffffffffffff510;
  Allocator *in_stack_fffffffffffff570;
  float local_a54;
  Option *in_stack_fffffffffffff638;
  undefined7 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff647;
  Mat *in_stack_fffffffffffff648;
  ConvolutionDepthWise3D *in_stack_fffffffffffff650;
  bool local_991;
  int local_974;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined4 local_958;
  long *local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined8 local_930;
  long local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  int local_8d4;
  long local_8d0;
  float local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  int local_8b0;
  int local_8ac;
  long local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_888;
  long local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined8 local_860;
  long local_858;
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  float local_83c;
  float local_838;
  int local_834;
  undefined8 local_830;
  undefined8 local_828;
  undefined8 local_820;
  undefined4 local_818;
  long *local_810;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined8 local_7f0;
  long local_7e8;
  float local_7e0;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  void *local_7d0;
  int *local_7c8;
  ulong local_7c0;
  undefined4 local_7b8;
  long *local_7b0;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  undefined4 local_79c;
  int local_798;
  ulong local_790;
  long local_788;
  undefined8 local_780;
  undefined8 local_778;
  undefined8 local_770;
  undefined4 local_768;
  long local_760;
  undefined4 local_758;
  undefined4 local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  undefined8 local_740;
  long local_738;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  reference local_710;
  vector<int,_std::allocator<int>_> local_700;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  undefined4 local_6d8;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  ulong local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  void *local_680;
  int *local_678;
  ulong local_670;
  undefined4 local_668;
  long *local_660;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  long local_640;
  int local_634;
  int local_630;
  int local_62c;
  undefined8 local_628;
  int local_620;
  int local_61c;
  int local_618;
  int local_614;
  long *local_608;
  int local_5ec;
  void **local_5e8;
  undefined8 *local_5e0;
  undefined8 *local_5d0;
  void **local_5c0;
  undefined8 *local_5b0;
  undefined8 *local_5a0;
  undefined8 *local_590;
  void **local_580;
  long *local_570;
  void **local_568;
  undefined1 local_55d;
  int local_55c;
  void **local_558;
  undefined8 *local_550;
  undefined1 local_53d;
  int local_53c;
  undefined8 *local_530;
  undefined1 local_51d;
  int local_51c;
  void **local_518;
  void **local_510;
  undefined1 local_4fd;
  int local_4fc;
  undefined8 *local_4f0;
  undefined8 *local_4e0;
  undefined8 *local_4d8;
  long *local_4d0;
  long *local_4c8;
  long local_4c0;
  long *local_4b8;
  long local_4b0;
  long *local_4a8;
  int local_49c;
  undefined8 *local_498;
  undefined8 *local_490;
  int local_484;
  void **local_480;
  undefined8 *local_478;
  int local_46c;
  undefined8 *local_468;
  int local_45c;
  undefined8 *local_458;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  float local_438;
  float local_434;
  float local_430;
  float local_42c;
  long *local_428;
  undefined4 local_420;
  float local_41c [3];
  long *local_410;
  undefined8 local_408;
  long *local_400;
  undefined8 local_3f8;
  long *local_3f0;
  undefined8 local_3e8;
  long *local_3e0;
  undefined8 local_3d8;
  long *local_3d0;
  float local_3c4;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  long *local_3a0;
  undefined4 local_398;
  float local_394 [3];
  long *local_388;
  undefined8 local_380;
  long *local_378;
  undefined8 local_370;
  long *local_368;
  undefined8 local_360;
  long *local_358;
  undefined8 local_350;
  long *local_348;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  undefined8 *local_2c8;
  undefined8 *local_2a8;
  undefined8 *local_288;
  int local_270;
  undefined4 local_26c;
  void **local_268;
  undefined8 *local_248;
  undefined8 *local_228;
  void *local_200;
  void *local_1c0;
  void **local_190;
  long *local_188;
  long local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  long *local_148;
  undefined4 local_13c;
  ulong local_138;
  void *local_130;
  void **local_118;
  long local_110;
  undefined4 local_104;
  long local_100;
  long local_f8;
  undefined4 local_ec;
  int local_e8;
  int local_e4;
  undefined8 *local_e0;
  long *local_d8;
  undefined4 local_cc;
  ulong local_c8;
  void *local_c0;
  undefined8 *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long *local_60;
  undefined4 local_54;
  ulong local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  long *local_30;
  undefined4 local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_614 = *(int *)(in_RSI + 0x2c);
  local_618 = *(int *)(in_RSI + 0x30);
  local_61c = *(int *)(in_RSI + 0x34);
  local_620 = *(int *)(in_RSI + 0x38);
  local_628 = *(undefined8 *)(in_RSI + 0x10);
  local_62c = *(int *)(in_RDI + 0xe0) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_630 = *(int *)(in_RDI + 0xe4) * (*(int *)(in_RDI + 0xd8) + -1) + 1;
  local_634 = *(int *)(in_RDI + 0xe8) * (*(int *)(in_RDI + 0xdc) + -1) + 1;
  local_5e8 = &local_680;
  local_680 = (void *)0x0;
  local_678 = (int *)0x0;
  local_670 = 0;
  local_668 = 0;
  local_660 = (long *)0x0;
  local_658 = 0;
  local_654 = 0;
  local_650 = 0;
  local_64c = 0;
  local_648 = 0;
  local_640 = 0;
  local_6c8 = *in_RCX;
  uStack_6c0 = in_RCX[1];
  local_6b8 = *(undefined4 *)(in_RCX + 2);
  uStack_6b4 = *(undefined4 *)((long)in_RCX + 0x14);
  uStack_6b0 = *(undefined4 *)(in_RCX + 3);
  uStack_6ac = *(undefined4 *)((long)in_RCX + 0x1c);
  uStack_6a0 = in_RCX[5];
  local_698 = in_RCX[6];
  uStack_690 = in_RCX[7];
  local_6a8 = in_RCX[4] & 0xffffffffffffff;
  local_608 = in_RDX;
  make_padding(in_stack_fffffffffffff650,in_stack_fffffffffffff648,
               (Mat *)CONCAT17(in_stack_fffffffffffff647,in_stack_fffffffffffff640),
               in_stack_fffffffffffff638);
  local_568 = &local_680;
  if (local_680 != (void *)0x0) {
    local_190 = local_568;
  }
  local_991 = local_680 != (void *)0x0 && local_640 * local_648 != 0;
  if (local_991) {
    local_614 = local_654;
    local_618 = local_650;
    local_61c = local_64c;
    local_6dc = (local_654 - local_62c) / *(int *)(in_RDI + 0xec) + 1;
    local_6e0 = (local_650 - local_630) / *(int *)(in_RDI + 0xf0) + 1;
    local_6e4 = (local_64c - local_634) / *(int *)(in_RDI + 0xf4) + 1;
    local_6e8 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
    std::allocator<int>::allocator((allocator<int> *)0x1ac9fd4);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff510,
               CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
               (allocator_type *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
    std::allocator<int>::~allocator((allocator<int> *)0x1aca000);
    local_710 = std::vector<int,_std::allocator<int>_>::operator[](&local_700,0);
    local_714 = 0;
    local_718 = 0;
    local_71c = local_614 * *(int *)(in_RDI + 0xe4) -
                *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xe0);
    local_720 = local_618 * local_614 * *(int *)(in_RDI + 0xe8) -
                local_614 * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xe4);
    for (local_724 = 0; local_724 < *(int *)(in_RDI + 0xdc); local_724 = local_724 + 1) {
      for (local_728 = 0; local_728 < *(int *)(in_RDI + 0xd8); local_728 = local_728 + 1) {
        for (local_72c = 0; local_72c < *(int *)(in_RDI + 0xd4); local_72c = local_72c + 1) {
          local_710[local_714] = local_718;
          local_714 = local_714 + 1;
          local_718 = *(int *)(in_RDI + 0xe0) + local_718;
        }
        local_718 = local_71c + local_718;
      }
      local_718 = local_720 + local_718;
    }
    Mat::create(in_stack_fffffffffffff510,in_stack_fffffffffffff50c,in_stack_fffffffffffff508,
                (int)in_stack_fffffffffffff504,in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                in_stack_fffffffffffff570);
    local_570 = local_608;
    bVar2 = true;
    if (*local_608 != 0) {
      local_188 = local_608;
      bVar2 = local_608[8] * (long)(int)local_608[7] == 0;
    }
    if (bVar2) {
      local_5ec = -100;
    }
    else {
      if ((local_620 == *(int *)(in_RDI + 0x11c)) &&
         (*(int *)(in_RDI + 0x11c) == *(int *)(in_RDI + 0xd0))) {
        for (local_730 = 0; local_730 < *(int *)(in_RDI + 0x11c); local_730 = local_730 + 1) {
          local_4f0 = &local_780;
          local_154 = *(int *)((long)local_608 + 0x2c);
          local_158 = (int)local_608[6];
          local_15c = *(undefined4 *)((long)local_608 + 0x34);
          local_738 = *local_608 + local_608[8] * (long)local_730 * local_608[2];
          local_170 = local_608[2];
          local_174 = (undefined4)local_608[3];
          local_180 = local_608[4];
          local_150 = &local_780;
          local_68 = (long)local_154 * (long)local_158 * local_170;
          local_4d8 = &local_780;
          local_5e0 = &local_780;
          local_6c = 0x10;
          local_4fc = local_730;
          local_4fd = 1;
          local_780 = 0;
          local_770 = 0;
          local_768 = 0;
          local_754 = 0;
          local_750 = 0;
          local_74c = 0;
          local_748 = 0;
          local_778 = 0;
          local_4c8 = (long *)(in_RDI + 0x170);
          local_788 = *local_4c8 + (long)(local_6e8 * local_730) * 4;
          local_510 = &local_7d0;
          local_518 = &local_680;
          local_130 = (void *)((long)local_680 + local_640 * local_730 * local_670);
          local_118 = &local_7d0;
          local_7c8 = (int *)0x0;
          local_7c0 = local_670;
          local_7b8 = local_668;
          local_7b0 = local_660;
          local_7a4 = local_654;
          local_7a0 = local_650;
          local_79c = 1;
          local_798 = local_64c;
          local_78 = (long)local_654 * (long)local_650 * local_670;
          local_790 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_670;
          local_7a8 = local_658 + -1;
          if (local_658 == 4) {
            local_790 = (long)local_654 * (long)local_650;
          }
          local_7c = 0x10;
          local_138 = local_670;
          local_13c = local_668;
          local_148 = local_660;
          local_51c = local_730;
          local_51d = 1;
          local_740 = 0;
          local_758 = 0;
          local_228 = local_5e0;
          local_168 = local_738;
          local_7d0 = local_130;
          local_760 = local_180;
          for (local_7d4 = 0; local_7d4 < local_6e4; local_7d4 = local_7d4 + 1) {
            for (local_7d8 = 0; local_7d8 < local_6e0; local_7d8 = local_7d8 + 1) {
              for (local_7dc = 0; local_7dc < local_6dc; local_7dc = local_7dc + 1) {
                local_7e0 = 0.0;
                if (*(int *)(in_RDI + 0x114) != 0) {
                  local_4a8 = (long *)(in_RDI + 0x1b8);
                  local_4b0 = (long)local_730;
                  local_7e0 = *(float *)(*local_4a8 + local_4b0 * 4);
                }
                local_484 = local_7d4 * *(int *)(in_RDI + 0xf4);
                local_478 = &local_830;
                local_480 = &local_7d0;
                local_48 = (void *)((long)local_7d0 +
                                   (long)local_7a4 * (long)local_7a0 * (long)local_484 * local_7c0);
                local_38 = &local_830;
                local_45c = local_7d8 * *(int *)(in_RDI + 0xf0);
                local_458 = &local_830;
                local_7e8 = (long)local_48 +
                            (long)(local_7dc * *(int *)(in_RDI + 0xec)) * 4 +
                            (long)local_7a4 * (long)local_45c * local_7c0;
                local_5d0 = &local_830;
                local_810 = local_7b0;
                local_3c = local_7a4;
                local_40 = local_7a0;
                local_50 = local_7c0;
                local_54 = local_7b8;
                local_60 = local_7b0;
                local_830 = 0;
                local_820 = 0;
                local_818 = 0;
                local_808 = 0;
                local_804 = 0;
                local_800 = 0;
                local_7fc = 0;
                local_7f8 = 0;
                local_7f0 = 0;
                local_828 = 0;
                for (local_834 = 0; fVar3 = local_7e0, local_834 < local_6e8;
                    local_834 = local_834 + 1) {
                  local_838 = *(float *)(local_7e8 + (long)local_710[local_834] * 4);
                  local_83c = *(float *)(local_788 + (long)local_834 * 4);
                  local_7e0 = local_838 * local_83c + local_7e0;
                }
                local_398 = *(undefined4 *)(in_RDI + 0x120);
                local_3a0 = (long *)(in_RDI + 0x128);
                local_394[0] = local_7e0;
                local_248 = local_5d0;
                switch(local_398) {
                case 1:
                  if (local_7e0 <= 0.0) {
                    local_394[0] = 0.0;
                  }
                  break;
                case 2:
                  local_350 = 0;
                  local_3a4 = *(float *)*local_3a0;
                  if (local_7e0 <= 0.0) {
                    local_a54 = local_7e0 * local_3a4;
                  }
                  else {
                    local_a54 = local_7e0;
                  }
                  local_394[0] = local_a54;
                  local_348 = local_3a0;
                  break;
                case 3:
                  local_360 = 0;
                  local_3a8 = *(float *)*local_3a0;
                  local_370 = 1;
                  local_3ac = *(float *)(*local_3a0 + 4);
                  if (local_7e0 < local_3a8) {
                    local_394[0] = local_3a8;
                  }
                  local_368 = local_3a0;
                  local_358 = local_3a0;
                  if (local_3ac < local_394[0]) {
                    local_394[0] = local_3ac;
                  }
                  break;
                case 4:
                  local_3b0 = 88.37626;
                  pfVar1 = std::min<float>(local_394,&local_3b0);
                  local_394[0] = *pfVar1;
                  local_3b4 = -88.37626;
                  pfVar1 = std::max<float>(local_394,&local_3b4);
                  local_394[0] = *pfVar1;
                  fVar3 = expf(-local_394[0]);
                  local_394[0] = 1.0 / (fVar3 + 1.0);
                  break;
                case 5:
                  fVar4 = expf(local_7e0);
                  fVar4 = logf(fVar4 + 1.0);
                  local_394[0] = tanhf(fVar4);
                  local_394[0] = fVar3 * local_394[0];
                  break;
                case 6:
                  local_380 = 0;
                  local_3b8 = *(float *)*local_3a0;
                  local_394[1] = 1.4013e-45;
                  local_394[2] = 0.0;
                  local_3bc = *(float *)(*local_3a0 + 4);
                  local_3c0 = -local_3bc / local_3b8;
                  local_3c4 = 1.0 / local_3b8 + local_3c0;
                  local_388 = local_3a0;
                  local_378 = local_3a0;
                  if (local_3c0 <= local_7e0) {
                    if (local_7e0 <= local_3c4) {
                      local_394[0] = local_7e0 * (local_7e0 * local_3b8 + local_3bc);
                    }
                  }
                  else {
                    local_394[0] = 0.0;
                  }
                }
                *(float *)(local_738 + (long)local_7dc * 4) = local_394[0];
              }
              local_738 = local_738 + (long)local_6dc * 4;
            }
          }
          local_5c0 = &local_7d0;
          local_268 = local_5c0;
          if (local_7c8 != (int *)0x0) {
            local_26c = 0xffffffff;
            LOCK();
            local_270 = *local_7c8;
            *local_7c8 = *local_7c8 + -1;
            UNLOCK();
            if (local_270 == 1) {
              if (local_7b0 == (long *)0x0) {
                local_200 = local_7d0;
                if (local_7d0 != (void *)0x0) {
                  free(local_7d0);
                }
              }
              else {
                (**(code **)(*local_7b0 + 0x18))(local_7b0,local_7d0);
              }
            }
          }
          local_7d0 = (void *)0x0;
          local_7c0 = 0;
          local_7b8 = 0;
          local_7a8 = 0;
          local_7a4 = 0;
          local_7a0 = 0;
          local_79c = 0;
          local_798 = 0;
          local_790 = 0;
          local_7c8 = (int *)0x0;
        }
      }
      else {
        local_840 = local_620 / *(int *)(in_RDI + 0x11c);
        local_844 = *(int *)(in_RDI + 0xd0) / *(int *)(in_RDI + 0x11c);
        for (local_848 = 0; local_848 < *(int *)(in_RDI + 0x11c); local_848 = local_848 + 1) {
          for (local_84c = 0; local_84c < local_844; local_84c = local_84c + 1) {
            local_53c = local_848 * local_844 + local_84c;
            local_530 = &local_8a0;
            local_e4 = *(int *)((long)local_608 + 0x2c);
            local_e8 = (int)local_608[6];
            local_ec = *(undefined4 *)((long)local_608 + 0x34);
            local_858 = *local_608 + local_608[8] * (long)local_53c * local_608[2];
            local_100 = local_608[2];
            local_104 = (undefined4)local_608[3];
            local_110 = local_608[4];
            local_e0 = &local_8a0;
            local_88 = (long)local_e4 * (long)local_e8 * local_100;
            local_4e0 = &local_8a0;
            local_5b0 = &local_8a0;
            local_8c = 0x10;
            local_53d = 1;
            local_8a0 = 0;
            local_890 = 0;
            local_888 = 0;
            local_878 = 0;
            local_874 = 0;
            local_870 = 0;
            local_86c = 0;
            local_868 = 0;
            local_860 = 0;
            local_898 = 0;
            local_4d0 = (long *)(in_RDI + 0x170);
            local_8a8 = *local_4d0 + (long)(local_6e8 * local_840 * local_844 * local_848) * 4;
            local_8ac = *(int *)((long)local_608 + 0x2c);
            local_8b0 = (int)local_608[6];
            local_8b4 = *(int *)((long)local_608 + 0x34);
            local_288 = local_5b0;
            local_f8 = local_858;
            local_880 = local_110;
            for (local_8b8 = 0; local_8b8 < local_8b4; local_8b8 = local_8b8 + 1) {
              for (local_8bc = 0; local_8bc < local_8b0; local_8bc = local_8bc + 1) {
                for (local_8c0 = 0; local_8c0 < local_8ac; local_8c0 = local_8c0 + 1) {
                  local_8c4 = 0.0;
                  if (*(int *)(in_RDI + 0x114) != 0) {
                    local_4b8 = (long *)(in_RDI + 0x1b8);
                    local_4c0 = (long)(local_844 * local_848 + local_84c);
                    local_8c4 = *(float *)(*local_4b8 + local_4c0 * 4);
                  }
                  local_8d0 = local_8a8 + (long)(local_6e8 * local_840 * local_84c) * 4;
                  for (local_8d4 = 0; local_8d4 < local_840; local_8d4 = local_8d4 + 1) {
                    local_55c = local_840 * local_848 + local_8d4;
                    local_550 = &local_920;
                    local_558 = &local_680;
                    local_c0 = (void *)((long)local_680 + local_640 * local_55c * local_670);
                    local_a8 = &local_920;
                    local_98 = (long)local_654 * (long)local_650 * local_670;
                    local_49c = local_8b8 * *(int *)(in_RDI + 0xf4);
                    local_490 = &local_970;
                    local_498 = &local_920;
                    local_18 = (void *)((long)local_c0 +
                                       (long)local_654 * (long)local_650 * (long)local_49c *
                                       local_670);
                    local_8 = &local_970;
                    local_46c = local_8bc * *(int *)(in_RDI + 0xf0);
                    local_468 = &local_970;
                    local_928 = (long)local_18 +
                                (long)(local_8c0 * *(int *)(in_RDI + 0xec)) * 4 +
                                (long)local_654 * (long)local_46c * local_670;
                    local_5a0 = &local_970;
                    local_900 = local_660;
                    local_950 = local_660;
                    local_c = local_654;
                    local_10 = local_650;
                    local_20 = local_670;
                    local_24 = local_668;
                    local_30 = local_660;
                    local_9c = 0x10;
                    local_c8 = local_670;
                    local_cc = local_668;
                    local_d8 = local_660;
                    local_55d = 1;
                    local_970 = 0;
                    local_960 = 0;
                    local_958 = 0;
                    local_948 = 0;
                    local_944 = 0;
                    local_940 = 0;
                    local_93c = 0;
                    local_938 = 0;
                    local_930 = 0;
                    local_968 = 0;
                    for (local_974 = 0; local_974 < local_6e8; local_974 = local_974 + 1) {
                      local_8c4 = *(float *)(local_928 + (long)local_710[local_974] * 4) *
                                  *(float *)(local_8d0 + (long)local_974 * 4) + local_8c4;
                    }
                    local_8d0 = local_8d0 + (long)local_6e8 * 4;
                    local_590 = &local_920;
                    local_920 = 0;
                    local_910 = 0;
                    local_908 = 0;
                    local_8f8 = 0;
                    local_8f4 = 0;
                    local_8f0 = 0;
                    local_8ec = 0;
                    local_8e8 = 0;
                    local_8e0 = 0;
                    local_918 = 0;
                    local_2c8 = local_590;
                    local_2a8 = local_5a0;
                  }
                  local_420 = *(undefined4 *)(in_RDI + 0x120);
                  local_428 = (long *)(in_RDI + 0x128);
                  local_41c[0] = local_8c4;
                  switch(local_420) {
                  case 1:
                    if (local_8c4 <= 0.0) {
                      local_41c[0] = 0.0;
                    }
                    break;
                  case 2:
                    local_3d8 = 0;
                    local_42c = *(float *)*local_428;
                    local_3d0 = local_428;
                    if (local_8c4 <= 0.0) {
                      local_41c[0] = local_8c4 * local_42c;
                    }
                    break;
                  case 3:
                    local_3e8 = 0;
                    local_430 = *(float *)*local_428;
                    local_3f8 = 1;
                    local_434 = *(float *)(*local_428 + 4);
                    if (local_8c4 < local_430) {
                      local_41c[0] = local_430;
                    }
                    local_3f0 = local_428;
                    local_3e0 = local_428;
                    if (local_434 < local_41c[0]) {
                      local_41c[0] = local_434;
                    }
                    break;
                  case 4:
                    local_438 = 88.37626;
                    pfVar1 = std::min<float>(local_41c,&local_438);
                    local_41c[0] = *pfVar1;
                    local_43c = -88.37626;
                    pfVar1 = std::max<float>(local_41c,&local_43c);
                    local_41c[0] = *pfVar1;
                    fVar3 = expf(-local_41c[0]);
                    local_41c[0] = 1.0 / (fVar3 + 1.0);
                    break;
                  case 5:
                    fVar3 = local_8c4;
                    fVar4 = expf(local_8c4);
                    fVar4 = logf(fVar4 + 1.0);
                    local_41c[0] = tanhf(fVar4);
                    local_41c[0] = fVar3 * local_41c[0];
                    break;
                  case 6:
                    local_408 = 0;
                    local_440 = *(float *)*local_428;
                    local_41c[1] = 1.4013e-45;
                    local_41c[2] = 0.0;
                    local_444 = *(float *)(*local_428 + 4);
                    local_448 = -local_444 / local_440;
                    local_44c = 1.0 / local_440 + local_448;
                    local_410 = local_428;
                    local_400 = local_428;
                    if (local_448 <= local_8c4) {
                      if (local_8c4 <= local_44c) {
                        local_41c[0] = local_8c4 * (local_8c4 * local_440 + local_444);
                      }
                    }
                    else {
                      local_41c[0] = 0.0;
                    }
                  }
                  *(float *)(local_858 + (long)local_8c0 * 4) = local_41c[0];
                  in_stack_fffffffffffff504 = local_41c[0];
                }
                local_858 = local_858 + (long)local_8ac * 4;
              }
            }
          }
        }
      }
      local_5ec = 0;
    }
    local_6d8 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
  }
  else {
    local_5ec = -100;
    local_6d8 = 1;
  }
  ppvVar5 = &local_680;
  if (local_678 != (int *)0x0) {
    local_2ec = 0xffffffff;
    LOCK();
    local_2f0 = *local_678;
    *local_678 = *local_678 + -1;
    UNLOCK();
    if (local_2f0 == 1) {
      local_580 = ppvVar5;
      local_2e8 = ppvVar5;
      if (local_660 == (long *)0x0) {
        local_1c0 = local_680;
        if (local_680 != (void *)0x0) {
          free(local_680);
        }
      }
      else {
        (**(code **)(*local_660 + 0x18))(local_660,local_680);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return local_5ec;
}

Assistant:

int ConvolutionDepthWise3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                            sum = bias_data[g];

                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = activation_ss(sum, activation_type, activation_params);
                    }

                    outptr += outw;
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                float* outptr = top_blob.channel(g * num_output_g + p);
                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

                // shadowed variable for less openmp task args
                const int outw = top_blob.w;
                const int outh = top_blob.h;
                const int outd = top_blob.d;

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            float sum = 0.f;

                            if (bias_term)
                                sum = bias_data[num_output_g * g + p];

                            const float* kptr = weight_data_ptr + maxk * channels_g * p;

                            for (int q = 0; q < channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                                for (int l = 0; l < maxk; l++)
                                {
                                    float val = sptr[space_ofs[l]];

                                    float wt = kptr[l];
                                    sum += val * wt;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = activation_ss(sum, activation_type, activation_params);
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}